

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O3

DynamicObject * __thiscall
JsrtDebuggerObjectScope::GetJSONObject
          (JsrtDebuggerObjectScope *this,ScriptContext *scriptContext,bool forceSetValueProp)

{
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar1;
  bool bVar2;
  DynamicObject *object;
  
  pWVar1 = this->objectDisplay;
  bVar2 = Memory::ReferencedArenaAdapter::AddStrongReference(pWVar1->adapter);
  object = (DynamicObject *)0x0;
  if ((bVar2) && (pWVar1->p != (IDiagObjectModelDisplay *)0x0)) {
    object = Js::JavascriptLibrary::CreateObject
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,false,0);
    JsrtDebugUtils::AddPropertyToObject(object,(JsrtDebugPropertyId)0xf,this->index,scriptContext);
    JsrtDebugUtils::AddPropertyToObject
              (object,(JsrtDebugPropertyId)0xe,(this->super_JsrtDebuggerObjectBase).handle,
               scriptContext);
    Memory::ReferencedArenaAdapter::ReleaseStrongReference(this->objectDisplay->adapter);
  }
  return object;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectScope::GetJSONObject(Js::ScriptContext* scriptContext, bool forceSetValueProp)
{
    Js::IDiagObjectModelDisplay* modelDisplay = this->objectDisplay->GetStrongReference();

    Js::DynamicObject* scopeObject = nullptr;

    if (modelDisplay != nullptr)
    {
        scopeObject = scriptContext->GetLibrary()->CreateObject();
        JsrtDebugUtils::AddPropertyToObject(scopeObject, JsrtDebugPropertyId::index, this->index, scriptContext);
        JsrtDebugUtils::AddPropertyToObject(scopeObject, JsrtDebugPropertyId::handle, this->GetHandle(), scriptContext);

        this->objectDisplay->ReleaseStrongReference();
    }

    return scopeObject;
}